

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManOrigIdsStart(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  
  pVVar3 = p->vIdsOrig;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vIdsOrig->pArray = (int *)0x0;
      pVVar3 = p->vIdsOrig;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_001fb551;
    }
    free(pVVar3);
    p->vIdsOrig = (Vec_Int_t *)0x0;
  }
LAB_001fb551:
  iVar1 = p->nObjs;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  pVVar3->nCap = iVar2;
  if (iVar2 == 0) {
    pVVar3->pArray = (int *)0x0;
    pVVar3->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar2 << 2);
    pVVar3->pArray = __s;
    pVVar3->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)iVar1 << 2);
    }
  }
  p->vIdsOrig = pVVar3;
  return;
}

Assistant:

void Gia_ManOrigIdsStart( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vIdsOrig );
    p->vIdsOrig = Vec_IntStartFull( Gia_ManObjNum(p) );
}